

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O2

ogt_vox_transform *
ogt_vox_sample_instance_transform_global
          (ogt_vox_transform *__return_storage_ptr__,ogt_vox_instance *instance,uint32_t frame_index
          ,ogt_vox_scene *scene)

{
  ogt_vox_transform final_transform;
  ogt_vox_transform local_a0;
  ogt_vox_transform local_60;
  
  ogt_vox_sample_instance_transform_local(&local_a0,instance,frame_index);
  if ((ulong)instance->group_index == 0xffffffff) {
    __return_storage_ptr__->m30 = local_a0.m30;
    __return_storage_ptr__->m31 = local_a0.m31;
    __return_storage_ptr__->m32 = local_a0.m32;
    __return_storage_ptr__->m33 = local_a0.m33;
    __return_storage_ptr__->m20 = local_a0.m20;
    __return_storage_ptr__->m21 = local_a0.m21;
    __return_storage_ptr__->m22 = local_a0.m22;
    __return_storage_ptr__->m23 = local_a0.m23;
    __return_storage_ptr__->m10 = local_a0.m10;
    __return_storage_ptr__->m11 = local_a0.m11;
    __return_storage_ptr__->m12 = local_a0.m12;
    __return_storage_ptr__->m13 = local_a0.m13;
    __return_storage_ptr__->m00 = local_a0.m00;
    __return_storage_ptr__->m01 = local_a0.m01;
    __return_storage_ptr__->m02 = local_a0.m02;
    __return_storage_ptr__->m03 = local_a0.m03;
  }
  else {
    ogt_vox_sample_group_transform_global
              (&local_60,scene->groups + instance->group_index,frame_index,scene);
    ogt_vox_transform_multiply(__return_storage_ptr__,&local_a0,&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

ogt_vox_transform ogt_vox_sample_instance_transform_global(const ogt_vox_instance* instance, uint32_t frame_index, const ogt_vox_scene* scene)
    {
        ogt_vox_transform final_transform = ogt_vox_sample_instance_transform_local(instance, frame_index);
        uint32_t group_index = instance->group_index;
        if (group_index == k_invalid_group_index)
            return final_transform;
        const ogt_vox_group* group = &scene->groups[group_index];
        return ogt_vox_transform_multiply(final_transform, ogt_vox_sample_group_transform_global(group, frame_index, scene));
    }